

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall MCU::zigzag(MCU *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  BLOCK (*paaaadVar5) [2] [2];
  undefined1 *puVar6;
  int i;
  long lVar7;
  int j;
  long lVar8;
  int iVar9;
  BLOCK (*paaaadVar10) [2] [2];
  ulong uVar11;
  int zz [8] [8];
  ulong local_168;
  BLOCK (*local_160) [2] [2];
  BLOCK (*local_150) [2] [2];
  undefined1 local_138 [264];
  
  local_160 = this->mcu;
  lVar4 = 1;
  do {
    local_160 = local_160 + 1;
    bVar1 = subVector[lVar4].height;
    if ((ulong)bVar1 != 0) {
      bVar2 = subVector[lVar4].width;
      local_150 = local_160;
      local_168 = 0;
      do {
        if ((ulong)bVar2 != 0) {
          uVar11 = 0;
          paaaadVar10 = local_150;
          do {
            memcpy(local_138,&DAT_001062d0,0x100);
            lVar7 = 0;
            puVar6 = local_138;
            do {
              lVar8 = 0;
              do {
                iVar3 = *(int *)(puVar6 + lVar8 * 4);
                iVar9 = iVar3 + 7;
                if (-1 < iVar3) {
                  iVar9 = iVar3;
                }
                *(int *)(puVar6 + lVar8 * 4) =
                     (int)this->mcu[lVar4][local_168][uVar11][iVar9 >> 3][iVar3 % 8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 8);
              lVar7 = lVar7 + 1;
              puVar6 = puVar6 + 0x20;
            } while (lVar7 != 8);
            lVar7 = 0;
            paaaadVar5 = paaaadVar10;
            puVar6 = local_138;
            do {
              lVar8 = 0;
              do {
                (*paaaadVar5)[0][0][0][lVar8] = (double)*(int *)(puVar6 + lVar8 * 4);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 8);
              lVar7 = lVar7 + 1;
              puVar6 = puVar6 + 0x20;
              paaaadVar5 = (BLOCK (*) [2] [2])((*paaaadVar5)[0][0] + 1);
            } while (lVar7 != 8);
            uVar11 = uVar11 + 1;
            paaaadVar10 = (BLOCK (*) [2] [2])((*paaaadVar10)[0] + 1);
          } while (uVar11 != bVar2);
        }
        local_168 = local_168 + 1;
        local_150 = (BLOCK (*) [2] [2])(*local_150 + 1);
      } while (local_168 != bVar1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void zigzag() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    int zz[8][8] = {
                            { 0,  1,  5,  6, 14, 15, 27, 28},
                            { 2,  4,  7, 13, 16, 26, 29, 42},
                            { 3,  8, 12, 17, 25, 30, 41, 43},
                            { 9, 11, 18, 24, 31, 40, 44, 53},
                            {10, 19, 23, 32, 39, 45, 52, 54},
                            {20, 22, 33, 38, 46, 51, 55, 60},
                            {21, 34, 37, 47, 50, 56, 59, 61},
                            {35, 36, 48, 49, 57, 58, 62, 63}
                    };
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            zz[i][j] = mcu[id][h][w][zz[i][j] / 8][zz[i][j] % 8];
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = zz[i][j];
                        }
                    }
                }
            }
        }
    }